

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O2

void * TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::WriteFile
                 (void *t)

{
  TPZStackEqnStorage<double> *this;
  TPZEqnArray<double> *this_00;
  bool bVar1;
  ostream *poVar2;
  int64_t iVar3;
  int iVar4;
  long lVar5;
  unique_lock<std::mutex> lock;
  TPZStack<TPZEqnArray<double>_*,_10> local;
  
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,"Entering Decomposition");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  this = (TPZStackEqnStorage<double> *)((long)t + 0x20);
  do {
    local.super_TPZManVector<TPZEqnArray<double>_*,_10>.super_TPZVec<TPZEqnArray<double>_*>.
    fNElements = 0;
    local.super_TPZManVector<TPZEqnArray<double>_*,_10>.super_TPZVec<TPZEqnArray<double>_*>.fNAlloc
         = 0;
    local.super_TPZManVector<TPZEqnArray<double>_*,_10>.super_TPZVec<TPZEqnArray<double>_*>.
    _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_017d7488;
    local.super_TPZManVector<TPZEqnArray<double>_*,_10>.super_TPZVec<TPZEqnArray<double>_*>.fStore =
         local.super_TPZManVector<TPZEqnArray<double>_*,_10>.fExtAlloc;
    std::unique_lock<std::mutex>::unique_lock(&lock,(mutex_type *)((long)t + 0x1fbd8));
    if (*(long *)((long)t + 0x1fb70) == 0) {
      if (*(int *)((long)t + 130000) != 1) {
        std::condition_variable::wait((unique_lock *)((long)t + 0x1fc00));
        goto LAB_01184e79;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Leaving WHILE");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::ostream::flush();
      bVar1 = false;
      iVar4 = 3;
    }
    else {
LAB_01184e79:
      TPZManVector<TPZEqnArray<double>_*,_10>::operator=
                (&local.super_TPZManVector<TPZEqnArray<double>_*,_10>,
                 (TPZManVector<TPZEqnArray<double>_*,_10> *)((long)t + 0x1fb60));
      iVar4 = 0;
      bVar1 = true;
      TPZManVector<TPZEqnArray<double>_*,_10>::Resize
                ((TPZManVector<TPZEqnArray<double>_*,_10> *)((long)t + 0x1fb60),0);
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    if (bVar1) {
      iVar3 = local.super_TPZManVector<TPZEqnArray<double>_*,_10>.
              super_TPZVec<TPZEqnArray<double>_*>.fNElements;
      if (local.super_TPZManVector<TPZEqnArray<double>_*,_10>.super_TPZVec<TPZEqnArray<double>_*>.
          fNElements < 1) {
        iVar3 = 0;
      }
      for (lVar5 = 0; iVar3 != lVar5; lVar5 = lVar5 + 1) {
        TPZStackEqnStorage<double>::AddEqnArray
                  (this,local.super_TPZManVector<TPZEqnArray<double>_*,_10>.
                        super_TPZVec<TPZEqnArray<double>_*>.fStore[lVar5]);
        this_00 = local.super_TPZManVector<TPZEqnArray<double>_*,_10>.
                  super_TPZVec<TPZEqnArray<double>_*>.fStore[lVar5];
        if (this_00 != (TPZEqnArray<double> *)0x0) {
          TPZEqnArray<double>::~TPZEqnArray(this_00);
        }
        operator_delete(this_00,0x3290);
      }
      iVar4 = 0;
    }
    TPZManVector<TPZEqnArray<double>_*,_10>::~TPZManVector
              (&local.super_TPZManVector<TPZEqnArray<double>_*,_10>);
    if (iVar4 != 0) {
      TPZStackEqnStorage<double>::FinishWriting(this);
      TPZStackEqnStorage<double>::ReOpen(this);
      *(undefined4 *)((long)t + 130000) = 0;
      std::operator<<((ostream *)&std::cout,"Terminating write thread\n");
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void * TPZParFrontMatrix<TVar, store, front>::WriteFile(void *t){
	TPZParFrontMatrix<TVar, store, front> *parfront = (TPZParFrontMatrix<TVar, store, front>*) t;    
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Entering WriteFile thread execution";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	cout << endl << "Entering Decomposition" << endl;
	cout.flush();
	while(1){
		TPZStack<TPZEqnArray<TVar> *> local;
        {
            std::unique_lock<std::mutex> lock(parfront->fwritelock);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Acquired writelock";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            if(parfront->fEqnStack.NElements() == 0){
                if(parfront->fFinish == 1) {
#ifdef PZ_LOG
                    if (logger.isDebugEnabled())
                    {
                        std::stringstream sout;
                        sout << "Terminating WriteFile thread execution";
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif
                    cout << "Leaving WHILE" << endl;
                    cout.flush();
                    break;
                }
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Entering cond_wait on fwritecond variable";
                    LOGPZ_DEBUG(logger,sout.str())
                }
#endif
                parfront->fwritecond.wait(lock);
            }
            
            local = parfront->fEqnStack;
            parfront->fEqnStack.Resize(0);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Copied the equation stack releasing the writelock";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            
        }
		int64_t neqn = local.NElements();

		int64_t eq;
		for(eq=0; eq<neqn; eq++) {
			parfront->fStorage.AddEqnArray(local[eq]);
			delete local[eq];
		}
	}
	parfront->fStorage.FinishWriting();
	parfront->fStorage.ReOpen();
	parfront->fFinish = 0;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Releasing writelock";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Falling through on the write thread";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << "Terminating write thread\n";
	return (0);
}